

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
::operator()(ShadedRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  unsigned_long_long uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ImVec2 IVar5;
  GetterYs<unsigned_long_long> *pGVar6;
  TransformerLogLog *pTVar7;
  ImPlotPlot *pIVar8;
  GetterYRef *pGVar9;
  ImDrawVert *pIVar10;
  ImDrawIdx *pIVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  float fVar15;
  undefined1 auVar16 [12];
  ImPlotContext *pIVar17;
  ImPlotContext *pIVar18;
  int iVar19;
  ushort uVar20;
  ImDrawIdx IVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  double dVar30;
  float fVar34;
  float fVar35;
  undefined1 auVar31 [16];
  float fVar33;
  undefined1 auVar32 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar51;
  undefined1 auVar47 [16];
  
  pIVar17 = GImPlot;
  pGVar6 = this->Getter1;
  pTVar7 = this->Transformer;
  dVar30 = (double)(prim + 1);
  iVar19 = pGVar6->Count;
  uVar1 = *(unsigned_long_long *)
           ((long)pGVar6->Ys +
           (long)(((prim + 1 + pGVar6->Offset) % iVar19 + iVar19) % iVar19) * (long)pGVar6->Stride);
  auVar31._0_8_ = (double)CONCAT44(0x43300000,(int)uVar1);
  auVar31._8_4_ = (int)(uVar1 >> 0x20);
  auVar31._12_4_ = 0x45300000;
  dVar12 = log10((pGVar6->XScale * dVar30 + pGVar6->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar8 = pIVar17->CurrentPlot;
  dVar2 = pIVar17->LogDenX;
  dVar3 = (pIVar8->XAxis).Range.Min;
  dVar4 = (pIVar8->XAxis).Range.Max;
  dVar13 = log10(((auVar31._8_8_ - 1.9342813113834067e+25) + (auVar31._0_8_ - 4503599627370496.0)) /
                 pIVar8->YAxis[pTVar7->YAxis].Range.Min);
  pIVar18 = GImPlot;
  iVar19 = pTVar7->YAxis;
  pIVar8 = pIVar17->CurrentPlot;
  pGVar9 = this->Getter2;
  pTVar7 = this->Transformer;
  auVar39._8_8_ = dVar13;
  auVar39._0_8_ = dVar12;
  dVar12 = pGVar9->YRef;
  auVar14._8_4_ = SUB84(pIVar17->LogDenY[iVar19],0);
  auVar14._0_8_ = dVar2;
  auVar14._12_4_ = (int)((ulong)pIVar17->LogDenY[iVar19] >> 0x20);
  auVar40 = divpd(auVar39,auVar14);
  dVar2 = pIVar8->YAxis[iVar19].Range.Min;
  IVar5 = pIVar17->PixelRange[iVar19].Min;
  fVar29 = (float)(pIVar17->Mx *
                   (((double)(float)auVar40._0_8_ * (dVar4 - dVar3) + dVar3) -
                   (pIVar8->XAxis).Range.Min) + (double)IVar5.x);
  fVar33 = (float)(pIVar17->My[iVar19] *
                   (((double)(float)auVar40._8_8_ * (pIVar8->YAxis[iVar19].Range.Max - dVar2) +
                    dVar2) - dVar2) + (double)IVar5.y);
  dVar13 = log10((dVar30 * pGVar9->XScale + pGVar9->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar8 = pIVar18->CurrentPlot;
  dVar2 = pIVar18->LogDenX;
  dVar3 = (pIVar8->XAxis).Range.Min;
  dVar4 = (pIVar8->XAxis).Range.Max;
  dVar12 = log10(dVar12 / pIVar8->YAxis[pTVar7->YAxis].Range.Min);
  iVar19 = pTVar7->YAxis;
  auVar32._8_8_ = dVar12;
  auVar32._0_8_ = dVar13;
  auVar40._8_4_ = SUB84(pIVar18->LogDenY[iVar19],0);
  auVar40._0_8_ = dVar2;
  auVar40._12_4_ = (int)((ulong)pIVar18->LogDenY[iVar19] >> 0x20);
  auVar40 = divpd(auVar32,auVar40);
  pIVar8 = pIVar18->CurrentPlot;
  dVar2 = pIVar8->YAxis[iVar19].Range.Min;
  IVar5 = pIVar18->PixelRange[iVar19].Min;
  fVar27 = (float)(pIVar18->Mx *
                   (((double)(float)auVar40._0_8_ * (dVar4 - dVar3) + dVar3) -
                   (pIVar8->XAxis).Range.Min) + (double)IVar5.x);
  fVar28 = (float)(pIVar18->My[iVar19] *
                   (((double)(float)auVar40._8_8_ * (pIVar8->YAxis[iVar19].Range.Max - dVar2) +
                    dVar2) - dVar2) + (double)IVar5.y);
  fVar36 = (this->P11).x;
  fVar37 = (this->P11).y;
  fVar15 = (this->P12).x;
  fVar34 = (this->P12).y;
  uVar25 = -(uint)(fVar37 < fVar34);
  fVar35 = (float)(~-(uint)(fVar15 <= fVar36) & (uint)fVar15 |
                  (uint)fVar36 & -(uint)(fVar15 <= fVar36));
  fVar38 = (float)(~-(uint)(fVar34 <= fVar37) & (uint)fVar34 |
                  (uint)fVar37 & -(uint)(fVar34 <= fVar37));
  fVar42 = (float)(~-(uint)(fVar36 < fVar15) & (uint)fVar15 |
                  (uint)fVar36 & -(uint)(fVar36 < fVar15));
  fVar51 = (float)(~uVar25 & (uint)fVar34 | (uint)fVar37 & uVar25);
  uVar22 = -(uint)(fVar29 <= fVar35);
  uVar23 = -(uint)(fVar33 <= fVar38);
  uVar24 = -(uint)(fVar42 < fVar29);
  uVar26 = -(uint)(fVar51 < fVar33);
  fVar35 = (float)(~uVar22 & (uint)fVar29 | (uint)fVar35 & uVar22);
  fVar38 = (float)(~uVar23 & (uint)fVar33 | (uint)fVar38 & uVar23);
  fVar42 = (float)(~uVar24 & (uint)fVar29 | (uint)fVar42 & uVar24);
  fVar51 = (float)(~uVar26 & (uint)fVar33 | (uint)fVar51 & uVar26);
  uVar22 = -(uint)(fVar27 <= fVar35);
  uVar23 = -(uint)(fVar28 <= fVar38);
  uVar24 = -(uint)(fVar42 < fVar27);
  uVar26 = -(uint)(fVar51 < fVar28);
  auVar43._0_4_ = (uint)fVar35 & uVar22;
  auVar43._4_4_ = (uint)fVar38 & uVar23;
  auVar43._8_4_ = (uint)fVar42 & uVar24;
  auVar43._12_4_ = (uint)fVar51 & uVar26;
  auVar48._0_4_ = ~uVar22 & (uint)fVar27;
  auVar48._4_4_ = ~uVar23 & (uint)fVar28;
  auVar48._8_4_ = ~uVar24 & (uint)fVar27;
  auVar48._12_4_ = ~uVar26 & (uint)fVar28;
  auVar48 = auVar48 | auVar43;
  fVar35 = (cull_rect->Min).y;
  auVar50._4_4_ = -(uint)(fVar35 < auVar48._4_4_);
  auVar50._0_4_ = -(uint)((cull_rect->Min).x < auVar48._0_4_);
  auVar16._4_8_ = auVar48._8_8_;
  auVar16._0_4_ = -(uint)(auVar48._4_4_ < fVar35);
  auVar49._0_8_ = auVar16._0_8_ << 0x20;
  auVar49._8_4_ = -(uint)(auVar48._8_4_ < (cull_rect->Max).x);
  auVar49._12_4_ = -(uint)(auVar48._12_4_ < (cull_rect->Max).y);
  auVar50._8_8_ = auVar49._8_8_;
  iVar19 = movmskps((int)cull_rect,auVar50);
  if (iVar19 == 0xf) {
    fVar38 = fVar33 * fVar36 - fVar37 * fVar29;
    fVar42 = fVar28 * fVar15 - fVar34 * fVar27;
    fVar35 = fVar34 - fVar28;
    auVar44._4_4_ = fVar35;
    auVar44._0_4_ = fVar35;
    auVar44._8_4_ = fVar35;
    auVar44._12_4_ = fVar35;
    auVar45._4_12_ = auVar44._4_12_;
    auVar45._0_4_ = fVar35 * (fVar36 - fVar29) - (fVar37 - fVar33) * (fVar15 - fVar27);
    auVar41._0_4_ = fVar38 * (fVar15 - fVar27) - fVar42 * (fVar36 - fVar29);
    auVar41._4_4_ = fVar38 * fVar35 - fVar42 * (fVar37 - fVar33);
    auVar41._8_4_ = fVar33 * 0.0 - fVar28 * 0.0;
    auVar41._12_4_ = fVar33 * 0.0 - fVar28 * 0.0;
    auVar47._0_8_ = auVar45._0_8_;
    auVar47._8_4_ = fVar35;
    auVar47._12_4_ = fVar35;
    auVar46._8_8_ = auVar47._8_8_;
    auVar46._4_4_ = auVar45._0_4_;
    auVar46._0_4_ = auVar45._0_4_;
    auVar40 = divps(auVar41,auVar46);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = this->Col;
    pIVar10[1].pos.x = fVar29;
    pIVar10[1].pos.y = fVar33;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = this->Col;
    pIVar10[2].pos = auVar40._0_8_;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = this->Col;
    pIVar10[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = this->Col;
    IVar5.y = fVar28;
    IVar5.x = fVar27;
    pIVar10[4].pos = IVar5;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar10 + 5;
    uVar22 = DrawList->_VtxCurrentIdx;
    pIVar11 = DrawList->_IdxWritePtr;
    IVar21 = (ImDrawIdx)uVar22;
    *pIVar11 = IVar21;
    uVar20 = (byte)((byte)uVar25 & fVar28 < fVar33 | -(fVar34 < fVar37) & -(fVar33 < fVar28)) & 1;
    pIVar11[1] = IVar21 + uVar20 + 1;
    pIVar11[2] = IVar21 + 3;
    pIVar11[3] = IVar21 + 1;
    pIVar11[4] = (uVar20 ^ 3) + IVar21;
    pIVar11[5] = IVar21 + 4;
    DrawList->_IdxWritePtr = pIVar11 + 6;
    DrawList->_VtxCurrentIdx = uVar22 + 5;
  }
  (this->P11).x = fVar29;
  (this->P11).y = fVar33;
  (this->P12).x = fVar27;
  (this->P12).y = fVar28;
  return (char)iVar19 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }